

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

ProcessOpenModeResult * processOpenModeFlags(OpenMode openMode)

{
  QLatin1StringView other;
  bool bVar1;
  Int in_ESI;
  ProcessOpenModeResult *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  ProcessOpenModeResult *result;
  OpenModeFlag in_stack_ffffffffffffff2c;
  enum_type in_stack_ffffffffffffff30;
  ushort in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff37;
  byte bVar4;
  ProcessOpenModeResult *str;
  bool local_b1;
  QString *local_a8;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar5;
  ProcessOpenModeResult *pPVar6;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_6c;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_68;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_64;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_40;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_3c;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_14;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_10;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  in_RDI->ok = true;
  *(undefined3 *)&in_RDI->field_0x1 = 0xaaaaaa;
  in_RDI->openMode = (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)0xaaaaaaaa;
  (in_RDI->error).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->error).d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->error).d.size = -0x5555555555555556;
  str = in_RDI;
  pPVar6 = in_RDI;
  local_c.i = in_ESI;
  ProcessOpenModeResult::ProcessOpenModeResult
            ((ProcessOpenModeResult *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
  in_RDI->ok = false;
  local_10.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
       (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
       QFlags<QIODeviceBase::OpenModeFlag>::operator&
                 ((QFlags<QIODeviceBase::OpenModeFlag> *)
                  CONCAT17(in_stack_ffffffffffffff37,
                           CONCAT16(in_stack_ffffffffffffff36,
                                    CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))),
                  in_stack_ffffffffffffff2c);
  bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_10);
  local_b1 = false;
  if (bVar1) {
    local_14.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)
                    CONCAT17(in_stack_ffffffffffffff37,
                             CONCAT16(in_stack_ffffffffffffff36,
                                      CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
                            ),in_stack_ffffffffffffff2c);
    local_b1 = QFlags::operator_cast_to_bool((QFlags *)&local_14);
  }
  if (local_b1 == false) {
    local_3c.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)
                    CONCAT17(in_stack_ffffffffffffff37,
                             CONCAT16(in_stack_ffffffffffffff36,
                                      CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
                            ),in_stack_ffffffffffffff2c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_3c);
    bVar4 = 0;
    if (bVar1) {
      operator|((uint)CONCAT12(in_stack_ffffffffffffff36,in_stack_ffffffffffffff34),
                in_stack_ffffffffffffff30);
      local_40.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
           (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
           QFlags<QIODeviceBase::OpenModeFlag>::operator&
                     ((QFlags<QIODeviceBase::OpenModeFlag> *)
                      CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffff36,
                                              CONCAT24(in_stack_ffffffffffffff34,
                                                       in_stack_ffffffffffffff30))),
                      (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(str,0));
      bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_40);
      bVar4 = bVar1 ^ 0xff;
    }
    if ((bVar4 & 1) == 0) {
      operator|(CONCAT13(bVar4,CONCAT12(in_stack_ffffffffffffff36,in_stack_ffffffffffffff34)),
                in_stack_ffffffffffffff30);
      local_64.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
           (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
           QFlags<QIODeviceBase::OpenModeFlag>::operator&
                     ((QFlags<QIODeviceBase::OpenModeFlag> *)
                      CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffff36,
                                              CONCAT24(in_stack_ffffffffffffff34,
                                                       in_stack_ffffffffffffff30))),
                      (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(str,0));
      bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_64);
      if (bVar1) {
        QFlags<QIODeviceBase::OpenModeFlag>::operator|=
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_c,WriteOnly);
      }
      local_68.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
           (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
           QFlags<QIODeviceBase::OpenModeFlag>::operator&
                     ((QFlags<QIODeviceBase::OpenModeFlag> *)
                      CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffff36,
                                              CONCAT24(in_stack_ffffffffffffff34,
                                                       in_stack_ffffffffffffff30))),
                      in_stack_ffffffffffffff2c);
      bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_68);
      bVar3 = 0;
      if (bVar1) {
        operator|(CONCAT13(bVar4,(uint3)in_stack_ffffffffffffff34),in_stack_ffffffffffffff30);
        QFlags<QIODeviceBase::OpenModeFlag>::operator|
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)
                   CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff34,
                                                          in_stack_ffffffffffffff30))),
                   in_stack_ffffffffffffff2c);
        local_6c.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
             (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
             QFlags<QIODeviceBase::OpenModeFlag>::operator&
                       ((QFlags<QIODeviceBase::OpenModeFlag> *)
                        CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff34,
                                                               in_stack_ffffffffffffff30))),
                        (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(str,0));
        bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_6c);
        bVar3 = bVar1 ^ 0xff;
      }
      if ((bVar3 & 1) != 0) {
        QFlags<QIODeviceBase::OpenModeFlag>::operator|=
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_c,Truncate);
      }
      in_RDI->ok = true;
      (in_RDI->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = local_c.i;
    }
    else {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        (&str->ok,CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffff36,
                                                          CONCAT24(in_stack_ffffffffffffff34,
                                                                   in_stack_ffffffffffffff30))));
      other.m_data._7_1_ = uVar5;
      other.m_data._0_7_ = in_stack_ffffffffffffff80;
      other.m_size = (qsizetype)pPVar6;
      QString::operator=((QString *)QVar2.m_size,other);
    }
  }
  else {
    Qt::Literals::StringLiterals::operator____L1
              (&str->ok,CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,
                                          CONCAT24(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30))));
    QVar2.m_data._7_1_ = uVar5;
    QVar2.m_data._0_7_ = in_stack_ffffffffffffff80;
    QVar2.m_size = (qsizetype)pPVar6;
    QString::operator=(local_a8,QVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return str;
}

Assistant:

ProcessOpenModeResult processOpenModeFlags(QIODevice::OpenMode openMode)
{
    ProcessOpenModeResult result;
    result.ok = false;
    if ((openMode & QFile::NewOnly) && (openMode & QFile::ExistingOnly)) {
        qWarning("NewOnly and ExistingOnly are mutually exclusive");
        result.error = "NewOnly and ExistingOnly are mutually exclusive"_L1;
        return result;
    }

    if ((openMode & QFile::ExistingOnly) && !(openMode & (QFile::ReadOnly | QFile::WriteOnly))) {
        qWarning("ExistingOnly must be specified alongside ReadOnly, WriteOnly, or ReadWrite");
        result.error =
                    "ExistingOnly must be specified alongside ReadOnly, WriteOnly, or ReadWrite"_L1;
        return result;
    }

    // Either Append or NewOnly implies WriteOnly
    if (openMode & (QFile::Append | QFile::NewOnly))
        openMode |= QFile::WriteOnly;

    // WriteOnly implies Truncate when ReadOnly, Append, and NewOnly are not set.
    if ((openMode & QFile::WriteOnly) && !(openMode & (QFile::ReadOnly | QFile::Append | QFile::NewOnly)))
        openMode |= QFile::Truncate;

    result.ok = true;
    result.openMode = openMode;
    return result;
}